

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void sysbvm_weakValueDictionary_increaseCapacity
               (sysbvm_context_t *context,sysbvm_weakValueDictionary_t **dictionary)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  ulong local_78;
  size_t i;
  size_t newSize;
  size_t newCapacity;
  size_t oldCapacity;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_a6c61186 gcFrame;
  sysbvm_weakValueDictionary_t **dictionary_local;
  sysbvm_context_t *context_local;
  
  gcFrame.key = (sysbvm_tuple_t)dictionary;
  memset(&gcFrameRecord.roots,0,0x20);
  gcFrameRecord.roots = *(sysbvm_tuple_t **)(*(long *)gcFrame.key + 0x18);
  memset(&oldCapacity,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&oldCapacity);
  sVar1 = sysbvm_tuple_getSizeInSlots((sysbvm_tuple_t)gcFrameRecord.roots);
  newSize = sVar1 << 1;
  i = 0;
  if (newSize < 8) {
    newSize = 8;
  }
  gcFrame.oldStorage = (sysbvm_array_t *)sysbvm_array_create(context,newSize);
  *(sysbvm_array_t **)(*(long *)gcFrame.key + 0x18) = gcFrame.oldStorage;
  for (local_78 = 0; local_78 < sVar1; local_78 = local_78 + 1) {
    gcFrame.newStorage = (sysbvm_array_t *)gcFrameRecord.roots[local_78 + 2];
    if ((gcFrame.newStorage != (sysbvm_array_t *)0x0) &&
       (gcFrame.newStorage[1].header.field_0.typePointer != 0x4f)) {
      gcFrame.association = (sysbvm_weakValueAssociation_t *)(gcFrame.newStorage)->elements[0];
      sysbvm_dictionary_insertNoCheck
                (context,(sysbvm_dictionary_t **)gcFrame.key,
                 (sysbvm_weakValueAssociation_t **)&gcFrame.newStorage,
                 (sysbvm_tuple_t *)&gcFrame.association);
      i = i + 1;
    }
  }
  sVar2 = sysbvm_tuple_size_encode(context,i);
  *(sysbvm_tuple_t *)(*(long *)gcFrame.key + 0x10) = sVar2;
  return;
}

Assistant:

static void sysbvm_weakValueDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_weakValueDictionary_t **dictionary)
{
    struct {
        sysbvm_array_t *oldStorage;
        sysbvm_array_t *newStorage;
        sysbvm_weakValueAssociation_t *association;
        sysbvm_tuple_t key;
    } gcFrame = {
        .oldStorage = (sysbvm_array_t*)(*dictionary)->storage,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots((sysbvm_tuple_t)gcFrame.oldStorage);
    size_t newCapacity = oldCapacity * 2;
    size_t newSize = 0;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    gcFrame.newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    (*dictionary)->storage = (sysbvm_tuple_t)gcFrame.newStorage;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        gcFrame.association = (sysbvm_weakValueAssociation_t *)gcFrame.oldStorage->elements[i];
        if(gcFrame.association && gcFrame.association->value != SYSBVM_TOMBSTONE_TUPLE)
        {
            gcFrame.key = gcFrame.association->key;
            sysbvm_dictionary_insertNoCheck(context, dictionary, &gcFrame.association, &gcFrame.key);
            ++newSize;
        }
    }

    // We need to recompute the size due to deleted weak objects.
    (*dictionary)->size = sysbvm_tuple_size_encode(context, newSize);
}